

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppAVar2;
  uint32_t uVar3;
  pointer pcVar4;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  pointer psVar5;
  element_type *peVar6;
  pointer ppVar7;
  iterator __position;
  pointer ppVar8;
  long lVar9;
  bool bVar10;
  type_conflict1 tVar11;
  bool bVar12;
  int iVar13;
  Classifier CVar14;
  iterator __begin1;
  HorribleError *pHVar15;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var16;
  void *pvVar17;
  pointer puVar18;
  App *this_00;
  pointer psVar19;
  ulong extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  ArgumentMismatch *pAVar21;
  int iVar22;
  Option *pOVar23;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar24;
  uint uVar25;
  pointer pbVar26;
  long lVar27;
  App *pAVar28;
  undefined8 uVar29;
  size_type __n;
  ulong uVar30;
  string v;
  App *sub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nval;
  string arg_name;
  string rest;
  string value;
  string current;
  Classifier local_3e4;
  undefined1 local_3e0 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_3c0;
  App *local_3b8;
  pointer local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  string local_348;
  string local_328;
  undefined1 *local_308;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  string local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Any_data local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  anon_class_40_2_a297e68f_for__M_pred local_138;
  string local_110;
  string local_f0;
  string local_d0;
  _Any_data local_b0;
  char local_a0 [16];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar26 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_2f8._M_allocated_capacity = (size_type)&local_2e8;
  pcVar4 = pbVar26[-1]._M_dataplus._M_p;
  local_3c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,pcVar4,pcVar4 + pbVar26[-1]._M_string_length);
  local_368._M_allocated_capacity = (size_type)&local_358;
  local_368._8_8_ = 0;
  local_358._M_local_buf[0] = '\0';
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    bVar10 = detail::split_short((string *)&local_2f8,(string *)&local_368,&local_348);
    if (!bVar10) {
      pHVar15 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_b0._M_unused._M_object = local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar15,(string *)&local_b0);
      __cxa_throw(pHVar15,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (current_type == WINDOWS_STYLE) {
    bVar10 = detail::split_windows_style((string *)&local_2f8,(string *)&local_368,&local_328);
    if (!bVar10) {
      pHVar15 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"windows option parsed but missing! You should not see this",""
                );
      HorribleError::HorribleError(pHVar15,&local_d0);
      __cxa_throw(pHVar15,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar15 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar15,&local_f0);
      __cxa_throw(pHVar15,&HorribleError::typeinfo,Error::~Error);
    }
    bVar10 = detail::split_long((string *)&local_2f8,(string *)&local_368,&local_328);
    if (!bVar10) {
      pHVar15 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       *(pointer *)(local_3c0 + 8) + -1);
      HorribleError::HorribleError(pHVar15,&local_50);
      __cxa_throw(pHVar15,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var16._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_138.arg_name.field_2;
  local_138.arg_name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_368._M_allocated_capacity,
             local_368._8_8_ + local_368._M_allocated_capacity);
  local_138.current_type = current_type;
  _Var16 = ::std::
           find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                     (_Var16,__last,&local_138);
  pvVar24 = local_3c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.arg_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.arg_name._M_dataplus._M_p,
                    local_138.arg_name.field_2._M_allocated_capacity + 1);
  }
  if (_Var16._M_current ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar5 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar29 = local_368._M_allocated_capacity;
    for (psVar19 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_368._M_allocated_capacity = uVar29, psVar19 != psVar5; psVar19 = psVar19 + 1) {
      pAVar28 = (psVar19->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar28->name_)._M_string_length == 0) && (pAVar28->disabled_ == false)) &&
         (bVar10 = _parse_arg(pAVar28,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_3c0,current_type,param_3), bVar10)) {
        peVar6 = (psVar19->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar10 = true;
        if (peVar6->pre_parse_called_ == false) {
          lVar27 = *(long *)local_3c0;
          pbVar26 = *(pointer *)(local_3c0 + 8);
          peVar6->pre_parse_called_ = true;
          if ((peVar6->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
            local_3e0._0_8_ = (long)pbVar26 - lVar27 >> 5;
            (*(peVar6->pre_parse_callback_)._M_invoker)
                      ((_Any_data *)&peVar6->pre_parse_callback_,(unsigned_long *)local_3e0);
          }
        }
        goto LAB_001aad8a;
      }
      uVar29 = local_368._M_allocated_capacity;
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      if (1 < (ulong)local_368._8_8_) {
        pvVar17 = memchr((char *)(uVar29 + 1),0x2e,local_368._8_8_ - 1);
        __n = (long)pvVar17 - uVar29;
        if (__n != 0xffffffffffffffff && pvVar17 != (void *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368
                     ,0,__n);
          local_3b8 = _find_subcommand(this,(string *)local_3e0,true,false);
          pOVar23 = (Option *)(local_3e0 + 0x10);
          if ((Option *)local_3e0._0_8_ != pOVar23) {
            operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
          }
          pvVar24 = local_3c0;
          if (local_3b8 != (App *)0x0) {
            lVar27 = *(long *)(*(long *)(local_3c0 + 8) + -0x20);
            local_3e0._0_8_ = pOVar23;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3e0,lVar27,
                       *(long *)(*(long *)(local_3c0 + 8) + -0x18) + lVar27);
            lVar27 = *(long *)(pvVar24 + 8);
            *(long *)(pvVar24 + 8) = lVar27 + -0x20;
            if (*(long **)(lVar27 + -0x20) != (long *)(lVar27 + -0x10)) {
              operator_delete(*(long **)(lVar27 + -0x20),*(long *)(lVar27 + -0x10) + 1);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_368,__n + 1,0xffffffffffffffff);
            _parse_arg();
            if ((extraout_RAX & 1) == 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                     __n + 2,0xffffffffffffffff);
              *local_3a8._M_dataplus._M_p = '-';
              if ((pointer)0x2 < local_3a8._M_string_length) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_388,&local_3a8,3,0xffffffffffffffff);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          (pvVar24,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_388);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_allocated_capacity != &local_378) {
                  operator_delete((void *)local_388._M_allocated_capacity,
                                  local_378._M_allocated_capacity + 1);
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                resize(&local_3a8,2,'\0');
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pvVar24,&local_3a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                (ulong)(local_3a8.field_2._M_allocated_capacity + 1));
              }
              current_type = SHORT;
            }
            else {
              local_388._M_allocated_capacity = (size_type)&local_378;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--","");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0
                     ,__n + 3,0xffffffffffffffff);
              uVar29 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_allocated_capacity != &local_378) {
                uVar29 = local_378._M_allocated_capacity;
              }
              if ((ulong)uVar29 < (ulong)(local_2d8._8_8_ + local_388._8_8_)) {
                uVar29 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d8._M_allocated_capacity != &local_2c8) {
                  uVar29 = local_2c8._M_allocated_capacity;
                }
                if ((ulong)uVar29 < (ulong)(local_2d8._8_8_ + local_388._8_8_)) goto LAB_001ab0a9;
                pbVar20 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_2d8,0,0,(char *)local_388._M_allocated_capacity,
                                     local_388._8_8_);
              }
              else {
LAB_001ab0a9:
                pbVar20 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_388,(char *)local_2d8._M_allocated_capacity,
                                    local_2d8._8_8_);
              }
              local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
              ppVar7 = (pointer)(pbVar20->_M_dataplus)._M_p;
              paVar1 = &pbVar20->field_2;
              if (ppVar7 == (pointer)paVar1) {
                local_3a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_3a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
              }
              else {
                local_3a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_3a8._M_dataplus._M_p = (pointer)ppVar7;
              }
              local_3a8._M_string_length = pbVar20->_M_string_length;
              (pbVar20->_M_dataplus)._M_p = (pointer)paVar1;
              pbVar20->_M_string_length = 0;
              paVar1->_M_local_buf[0] = '\0';
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(pvVar24,&local_3a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                (ulong)(local_3a8.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_allocated_capacity != &local_2c8) {
                operator_delete((void *)local_2d8._M_allocated_capacity,
                                local_2c8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_allocated_capacity != &local_378) {
                operator_delete((void *)local_388._M_allocated_capacity,
                                local_378._M_allocated_capacity + 1);
              }
              current_type = LONG;
            }
            bVar12 = _parse_arg(local_3b8,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)pvVar24,current_type,true);
            if (bVar12) {
              if (local_3b8->silent_ == false) {
                __position._M_current =
                     (this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->parsed_subcommands_).
                    super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<CLI::App*,std::allocator<CLI::App*>>::
                  _M_realloc_insert<CLI::App*const&>
                            ((vector<CLI::App*,std::allocator<CLI::App*>> *)
                             &this->parsed_subcommands_,__position,&local_3b8);
                }
                else {
                  *__position._M_current = local_3b8;
                  pppAVar2 = &(this->parsed_subcommands_).
                              super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppAVar2 = *pppAVar2 + 1;
                }
              }
              increment_parsed(this);
              if (this->pre_parse_called_ == false) {
                lVar27 = *(long *)(pvVar24 + 8);
                lVar9 = *(long *)pvVar24;
                this->pre_parse_called_ = true;
                if ((this->pre_parse_callback_).super__Function_base._M_manager !=
                    (_Manager_type)0x0) {
                  local_3a8._M_dataplus._M_p = (pointer)(lVar27 - lVar9 >> 5);
                  (*(this->pre_parse_callback_)._M_invoker)
                            ((_Any_data *)&this->pre_parse_callback_,(unsigned_long *)&local_3a8);
                }
              }
              else if ((this->immediate_callback_ == true) && ((this->name_)._M_string_length != 0))
              {
                uVar3 = this->parsed_;
                ppVar7 = (this->missing_).
                         super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_3b0 = (this->missing_).
                            super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                ppVar8 = (this->missing_).
                         super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                (this->missing_).
                super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (this->missing_).
                super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (this->missing_).
                super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_388._M_allocated_capacity = (size_type)ppVar7;
                local_388._8_8_ = local_3b0;
                local_378._M_allocated_capacity = (size_type)ppVar8;
                clear(this);
                this->parsed_ = uVar3;
                this->pre_parse_called_ = true;
                local_3a8.field_2._M_allocated_capacity =
                     (size_type)
                     (this->missing_).
                     super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                (this->missing_).
                super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar8;
                local_3a8._M_dataplus._M_p =
                     (pointer)(this->missing_).
                              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                local_3a8._M_string_length =
                     (size_type)
                     (this->missing_).
                     super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                (this->missing_).
                super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = ppVar7;
                (this->missing_).
                super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = local_3b0;
                local_388._M_allocated_capacity = 0;
                local_388._8_8_ = 0;
                local_378._M_allocated_capacity = 0;
                std::
                vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_3a8);
                std::
                vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_388);
              }
              if ((local_3b8->parse_complete_callback_).super__Function_base._M_manager !=
                  (_Manager_type)0x0) {
                _process_env(local_3b8);
                _process_callbacks(local_3b8);
                _process_help_flags(local_3b8,false,false);
                _process_requirements(local_3b8);
                run_callback(local_3b8,false,true);
              }
            }
            else {
              lVar27 = *(long *)(pvVar24 + 8);
              *(long *)(pvVar24 + 8) = lVar27 + -0x20;
              if (*(long **)(lVar27 + -0x20) != (long *)(lVar27 + -0x10)) {
                operator_delete(*(long **)(lVar27 + -0x20),*(long *)(lVar27 + -0x10) + 1);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pvVar24,(value_type *)local_3e0);
            }
            if ((Option *)local_3e0._0_8_ != pOVar23) {
              operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
            }
            bVar10 = true;
            if (bVar12) goto LAB_001aad8a;
          }
        }
      }
      if (!param_3) {
        if ((this->parent_ == (App *)0x0) || (pAVar28 = this->parent_, this->fallthrough_ != true))
        {
          lVar27 = *(long *)(local_3c0 + 8);
          *(long *)(local_3c0 + 8) = lVar27 + -0x20;
          if (*(long **)(lVar27 + -0x20) != (long *)(lVar27 + -0x10)) {
            operator_delete(*(long **)(lVar27 + -0x20),*(long *)(lVar27 + -0x10) + 1);
          }
          local_3e0._0_4_ = current_type;
          pAVar28 = this;
          if (this->allow_extras_ == false) {
            psVar19 = (this->subcommands_).
                      super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while ((pAVar28 = this,
                   psVar19 !=
                   (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish &&
                   ((pAVar28 = (psVar19->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr, (pAVar28->name_)._M_string_length != 0 ||
                    (pAVar28->allow_extras_ == false))))) {
              psVar19 = psVar19 + 1;
            }
          }
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&pAVar28->missing_,(Classifier *)local_3e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8
                    );
          bVar10 = true;
        }
        else {
          do {
            this_00 = pAVar28;
            if (this_00->parent_ == (App *)0x0) break;
            pAVar28 = this_00->parent_;
          } while ((this_00->name_)._M_string_length == 0);
          bVar10 = _parse_arg(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_3c0,current_type,false);
        }
        goto LAB_001aad8a;
      }
    }
    bVar10 = false;
    goto LAB_001aad8a;
  }
  pbVar26 = *(pointer *)(pvVar24 + 8);
  *(pointer *)(pvVar24 + 8) = pbVar26 + -1;
  pcVar4 = pbVar26[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &pbVar26[-1].field_2) {
    operator_delete(pcVar4,pbVar26[-1].field_2._M_allocated_capacity + 1);
  }
  pOVar23 = ((_Var16._M_current)->_M_t).
            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (((pOVar23->inject_separator_ == true) &&
      (pbVar26 = (pOVar23->results_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
      (pOVar23->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar26)) && (pbVar26[-1]._M_string_length != 0))
  {
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    Option::_add_result(pOVar23,&local_158,&pOVar23->results_);
    pOVar23->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  pOVar23 = ((_Var16._M_current)->_M_t).
            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((pOVar23->trigger_on_result_ == true) && (pOVar23->current_option_state_ == callback_run)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&pOVar23->results_,
                      *(pointer *)
                       &(pOVar23->results_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl);
    pOVar23->current_option_state_ = parsing;
    pOVar23 = ((_Var16._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  iVar13 = pOVar23->type_size_min_;
  iVar22 = pOVar23->expected_min_ * iVar13;
  if (iVar13 <= iVar22) {
    iVar22 = iVar13;
  }
  local_3b0 = (pointer)CONCAT44(local_3b0._4_4_,iVar22);
  local_3e0._0_4_ = pOVar23->type_size_max_;
  tVar11 = detail::checked_multiply<int>((int *)local_3e0,pOVar23->expected_max_);
  local_3e4 = 0x20000000;
  if (tVar11) {
    local_3e4 = local_3e0._0_4_;
  }
  if ((int)local_3e4 < 0x2000000) {
LAB_001aa463:
    local_3e4 = local_3e0._0_4_;
    if (local_3e0._0_4_ != NONE) goto LAB_001aa46f;
    pOVar23 = ((_Var16._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_1d8._M_unused._M_object = &local_1c8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_328._M_dataplus._M_p,
               local_328._M_dataplus._M_p + local_328._M_string_length);
    Option::get_flag_value((string *)local_3e0,pOVar23,(string *)&local_368,(string *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_unused._0_8_ != &local_1c8) {
      operator_delete(local_1d8._M_unused._M_object,local_1c8._M_allocated_capacity + 1);
    }
    pOVar23 = ((_Var16._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_));
    Option::_add_result(pOVar23,(string *)&local_1f8,&pOVar23->results_);
    pOVar23->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_allocated_capacity != &local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,local_1e8._M_allocated_capacity + 1);
    }
    local_2b8._M_allocated_capacity =
         (size_type)
         ((_Var16._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
               (Option **)&local_2b8._M_allocated_capacity);
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
    }
    local_3e4 = NONE;
LAB_001aa7f4:
    iVar13 = 0;
  }
  else {
    pOVar23 = ((_Var16._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar23->allow_extra_args_ == false) {
      local_3e0._0_4_ = pOVar23->type_size_max_;
      tVar11 = detail::checked_multiply<int>((int *)local_3e0,pOVar23->expected_min_);
      local_3e4 = 0x20000000;
      if (tVar11) {
        goto LAB_001aa463;
      }
    }
LAB_001aa46f:
    if (local_328._M_string_length == 0) {
      if (local_348._M_string_length == 0) goto LAB_001aa7f4;
      pOVar23 = ((_Var16._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_348._M_dataplus._M_p,
                 local_348._M_dataplus._M_p + local_348._M_string_length);
      iVar13 = Option::_add_result(pOVar23,&local_238,&pOVar23->results_);
      pOVar23->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_3e0._0_8_ =
           ((_Var16._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)local_3e0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_348,0,local_348._M_string_length,"",0);
    }
    else {
      pOVar23 = ((_Var16._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_328._M_dataplus._M_p,
                 local_328._M_dataplus._M_p + local_328._M_string_length);
      iVar13 = Option::_add_result(pOVar23,&local_218,&pOVar23->results_);
      pOVar23->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_3e0._0_8_ =
           ((_Var16._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)local_3e0);
    }
  }
  if (iVar13 < (int)local_3b0) {
    do {
      pvVar24 = local_3c0;
      pbVar26 = *(pointer *)(local_3c0 + 8);
      if (*(pointer *)local_3c0 == pbVar26) {
        pAVar21 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_178,
                   ((_Var16._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        Option::get_type_name_abi_cxx11_
                  (&local_70,
                   ((_Var16._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        ArgumentMismatch::TypedAtLeast(pAVar21,&local_178,(int)local_3b0,&local_70);
        __cxa_throw(pAVar21,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      pcVar4 = pbVar26[-1]._M_dataplus._M_p;
      local_3e0._0_8_ = (Option *)(local_3e0 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_3e0,pcVar4,pcVar4 + pbVar26[-1]._M_string_length);
      pbVar26 = *(pointer *)(pvVar24 + 8);
      *(pointer *)(pvVar24 + 8) = pbVar26 + -1;
      pcVar4 = pbVar26[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &pbVar26[-1].field_2) {
        operator_delete(pcVar4,pbVar26[-1].field_2._M_allocated_capacity + 1);
      }
      pOVar23 = ((_Var16._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_298._M_allocated_capacity = (size_type)&local_288;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_));
      iVar22 = Option::_add_result(pOVar23,(string *)&local_298,&pOVar23->results_);
      pOVar23->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1)
        ;
      }
      local_2b8._M_allocated_capacity =
           (size_type)
           ((_Var16._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)&local_2b8._M_allocated_capacity);
      if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
        operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
      }
      iVar13 = iVar13 + iVar22;
    } while (iVar13 < (int)local_3b0);
  }
  if ((iVar13 < (int)local_3e4) ||
     ((((_Var16._M_current)->_M_t).
       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
    uVar30 = 0;
    for (puVar18 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar18 !=
        (this->options_).
        super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      pOVar23 = (puVar18->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (((((pOVar23->pname_)._M_string_length != 0) &&
           ((pOVar23->super_OptionBase<CLI::Option>).required_ == true)) &&
          (uVar25 = pOVar23->expected_min_ * pOVar23->type_size_min_, 0 < (int)uVar25)) &&
         (lVar27 = (long)(pOVar23->results_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   *(long *)&(pOVar23->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl >> 5, (int)lVar27 < (int)uVar25)) {
        uVar30 = (uVar30 + uVar25) - lVar27;
      }
    }
    local_308 = local_3e0 + 0x10;
    local_300 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    pvVar24 = local_3c0;
    do {
      if (iVar13 < (int)local_3e4) {
        pbVar26 = *(pointer *)(pvVar24 + 8);
      }
      else {
        pbVar26 = *(pointer *)(pvVar24 + 8);
        if ((((_Var16._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != true)
        goto LAB_001aab97;
      }
      if (*(pointer *)pvVar24 == pbVar26) goto LAB_001aab97;
      CVar14 = _recognize(this,pbVar26 + -1,false);
      pbVar26 = *(pointer *)(local_3c0 + 8);
      pvVar24 = local_3c0;
      if ((CVar14 != NONE) || ((ulong)((long)pbVar26 - *(long *)local_3c0 >> 5) <= uVar30))
      goto LAB_001aab97;
      if (this->validate_optional_arguments_ == true) {
        local_3e0._0_8_ = local_3e0 + 0x10;
        pcVar4 = pbVar26[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3e0,pcVar4,pcVar4 + pbVar26[-1]._M_string_length);
        Option::_validate((string *)&local_2b8,
                          ((_Var16._M_current)->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                          (string *)local_3e0,0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_allocated_capacity != &local_2a8) {
          operator_delete((void *)local_2b8._M_allocated_capacity,
                          local_2a8._M_allocated_capacity + 1);
        }
        uVar29 = local_3e0._8_8_;
        if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
          operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
        }
        pbVar26 = *(pointer *)(local_3c0 + 8);
        pvVar24 = local_3c0;
        if (uVar29 != 0) goto LAB_001aab97;
      }
      pOVar23 = ((_Var16._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      pcVar4 = pbVar26[-1]._M_dataplus._M_p;
      local_258._M_allocated_capacity = (size_type)&local_248;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,pcVar4,pcVar4 + pbVar26[-1]._M_string_length);
      iVar22 = Option::_add_result(pOVar23,(string *)&local_258,&pOVar23->results_);
      pOVar23->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_allocated_capacity != &local_248) {
        operator_delete((void *)local_258._M_allocated_capacity,local_248._M_allocated_capacity + 1)
        ;
      }
      local_3e0._0_8_ =
           ((_Var16._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                (local_300,(Option **)local_3e0);
      pvVar24 = local_3c0;
      pbVar26 = *(pointer *)(local_3c0 + 8);
      *(pointer *)(local_3c0 + 8) = pbVar26 + -1;
      pcVar4 = pbVar26[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &pbVar26[-1].field_2) {
        operator_delete(pcVar4,pbVar26[-1].field_2._M_allocated_capacity + 1);
      }
      iVar13 = iVar13 + iVar22;
    } while( true );
  }
LAB_001aace6:
  if (0 < (int)local_3b0) {
    pOVar23 = ((_Var16._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (iVar13 % pOVar23->type_size_max_ != 0) {
      if (pOVar23->type_size_max_ == pOVar23->type_size_min_) {
        pAVar21 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_1b8,
                   ((_Var16._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        pOVar23 = ((_Var16._M_current)->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar13 = pOVar23->type_size_min_;
        Option::get_type_name_abi_cxx11_(&local_90,pOVar23);
        ArgumentMismatch::PartialType(pAVar21,&local_1b8,iVar13,&local_90);
        __cxa_throw(pAVar21,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      local_198._M_string_length = 0;
      local_198.field_2._M_local_buf[0] = '\0';
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      Option::_add_result(pOVar23,&local_198,&pOVar23->results_);
      pOVar23->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT71(local_198.field_2._1_7_,local_198.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  pOVar23 = ((_Var16._M_current)->_M_t).
            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (pOVar23->trigger_on_result_ == true) {
    Option::run_callback(pOVar23);
  }
  bVar10 = true;
  if (local_348._M_string_length != 0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                     "-",&local_348);
    _parse_arg();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3c0,&local_348);
  }
LAB_001aad8a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                             local_348.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                             local_328.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_allocated_capacity != &local_358) {
    operator_delete((void *)local_368._M_allocated_capacity,
                    CONCAT71(local_358._M_allocated_capacity._1_7_,local_358._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_allocated_capacity != &local_2e8) {
    operator_delete((void *)local_2f8._M_allocated_capacity,local_2e8._M_allocated_capacity + 1);
  }
  return bVar10;
LAB_001aab97:
  if ((*(pointer *)pvVar24 != pbVar26) &&
     (CVar14 = _recognize(this,pbVar26 + -1,true), CVar14 == POSITIONAL_MARK)) {
    pbVar26 = *(pointer *)(pvVar24 + 8);
    *(pointer *)(pvVar24 + 8) = pbVar26 + -1;
    pcVar4 = pbVar26[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &pbVar26[-1].field_2) {
      operator_delete(pcVar4,pbVar26[-1].field_2._M_allocated_capacity + 1);
    }
  }
  if ((0 < (int)local_3e4) && (iVar13 == 0 && (int)local_3b0 == 0)) {
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    Option::get_flag_value
              ((string *)local_3e0,
               ((_Var16._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,(string *)&local_368,
               &local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    pOVar23 = ((_Var16._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_));
    Option::_add_result(pOVar23,&local_278,&pOVar23->results_);
    pOVar23->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_2b8._M_allocated_capacity =
         (size_type)
         ((_Var16._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              (local_300,(Option **)&local_2b8._M_allocated_capacity);
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
    }
  }
  goto LAB_001aace6;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    if(op_ptr == std::end(options_)) {
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}